

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_scaling.c
# Opt level: O0

cupdlp_retcode
scale_problem(CUPDLPcsc *csc,cupdlp_float *cost,cupdlp_float *lower,cupdlp_float *upper,
             cupdlp_float *rhs,cupdlp_float *col_scaling,cupdlp_float *row_scaling)

{
  cupdlp_int len;
  int len_00;
  cupdlp_float *in_RCX;
  cupdlp_float *in_RDX;
  cupdlp_float *in_RSI;
  cupdlp_int *in_RDI;
  cupdlp_float *in_R8;
  cupdlp_float *in_R9;
  int j;
  int i_1;
  int i;
  cupdlp_int nCols;
  cupdlp_int nRows;
  cupdlp_retcode retcode;
  int local_48;
  int local_44;
  int local_40;
  
  len = *in_RDI;
  len_00 = in_RDI[1];
  cupdlp_cdiv(in_RSI,in_R9,len_00);
  cupdlp_cdot(in_RDX,in_R9,len_00);
  cupdlp_cdot(in_RCX,in_R9,len_00);
  cupdlp_cdiv(in_R8,_i,len);
  for (local_40 = 0; local_40 < *(int *)(*(long *)(in_RDI + 4) + (long)len_00 * 4);
      local_40 = local_40 + 1) {
    *(double *)(*(long *)(in_RDI + 8) + (long)local_40 * 8) =
         *(double *)(*(long *)(in_RDI + 8) + (long)local_40 * 8) /
         _i[*(int *)(*(long *)(in_RDI + 6) + (long)local_40 * 4)];
  }
  for (local_44 = 0; local_44 < len_00; local_44 = local_44 + 1) {
    for (local_48 = *(int *)(*(long *)(in_RDI + 4) + (long)local_44 * 4);
        local_48 < *(int *)(*(long *)(in_RDI + 4) + (long)(local_44 + 1) * 4);
        local_48 = local_48 + 1) {
      *(double *)(*(long *)(in_RDI + 8) + (long)local_48 * 8) =
           *(double *)(*(long *)(in_RDI + 8) + (long)local_48 * 8) / in_R9[local_44];
    }
  }
  return 0;
}

Assistant:

cupdlp_retcode scale_problem(CUPDLPcsc *csc, cupdlp_float *cost,
                             cupdlp_float *lower, cupdlp_float *upper,
                             cupdlp_float *rhs, cupdlp_float *col_scaling,
                             cupdlp_float *row_scaling) {
  cupdlp_retcode retcode = RETCODE_OK;
  cupdlp_int nRows = csc->nRows;
  cupdlp_int nCols = csc->nCols;

  cupdlp_cdiv(cost, col_scaling, nCols);
  cupdlp_cdot(lower, col_scaling, nCols);
  cupdlp_cdot(upper, col_scaling, nCols);
  cupdlp_cdiv(rhs, row_scaling, nRows);

  // row scaling
  for (int i = 0; i < csc->colMatBeg[nCols]; i++) {
    csc->colMatElem[i] /= row_scaling[csc->colMatIdx[i]];
  }
  // col scaling
  for (int i = 0; i < nCols; i++) {
    for (int j = csc->colMatBeg[i]; j < csc->colMatBeg[i + 1]; j++) {
      csc->colMatElem[j] /= col_scaling[i];
    }
  }

  // w->scaling->ifScaled = 1;

exit_cleanup:
  return retcode;
}